

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O0

void __thiscall deqp::gls::MultiTextureSamplerTest::render(MultiTextureSamplerTest *this)

{
  GLenum GVar1;
  code *pcVar2;
  RenderContext *pRVar3;
  int iVar4;
  deUint32 dVar5;
  GLint GVar6;
  deBool dVar7;
  GLint GVar8;
  GLint GVar9;
  undefined4 extraout_var;
  TestError *pTVar11;
  VertexArrayBinding *local_4d0;
  VertexArrayBinding *local_458;
  VertexArrayBinding *local_3e0;
  PrimitiveList local_360;
  PrimitiveList local_348;
  undefined1 local_329;
  VertexArrayPointer local_328;
  allocator<char> local_301;
  string local_300;
  BindingPoint local_2e0;
  undefined1 *local_2b0;
  undefined1 local_2a8 [8];
  VertexArrayBinding vertexArrays_2 [1];
  PrimitiveList local_250;
  PrimitiveList local_238;
  undefined1 local_219;
  VertexArrayPointer local_218;
  allocator<char> local_1f1;
  string local_1f0;
  BindingPoint local_1d0;
  undefined1 *local_1a0;
  undefined1 local_198 [8];
  VertexArrayBinding vertexArrays_1 [1];
  PrimitiveList local_140;
  PrimitiveList local_128;
  undefined1 local_109;
  VertexArrayPointer local_108;
  allocator<char> local_e1;
  string local_e0;
  BindingPoint local_c0;
  undefined1 *local_90;
  undefined1 local_88 [8];
  VertexArrayBinding vertexArrays [1];
  GLuint scaleLoc;
  GLuint samplerLoc2;
  GLuint samplerLoc1;
  Functions *gl;
  MultiTextureSamplerTest *this_local;
  long lVar10;
  
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar4);
  pcVar2 = *(code **)(lVar10 + 0x1680);
  dVar5 = glu::ShaderProgram::getProgram(this->m_program);
  (*pcVar2)(dVar5);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"glUseProgram(m_program->getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x318);
  dVar5 = glu::ShaderProgram::getProgram(this->m_program);
  GVar6 = glwGetUniformLocation(dVar5,"u_sampler1");
  while ((dVar7 = ::deGetFalse(), dVar7 == 0 && (GVar6 != -1))) {
    dVar7 = ::deGetFalse();
    if (dVar7 == 0) {
      dVar5 = glu::ShaderProgram::getProgram(this->m_program);
      GVar8 = glwGetUniformLocation(dVar5,"u_sampler2");
      while ((dVar7 = ::deGetFalse(), dVar7 == 0 && (GVar8 != -1))) {
        dVar7 = ::deGetFalse();
        if (dVar7 == 0) {
          dVar5 = glu::ShaderProgram::getProgram(this->m_program);
          GVar9 = glwGetUniformLocation(dVar5,"u_posScale");
          while ((dVar7 = ::deGetFalse(), dVar7 == 0 && (GVar9 != -1))) {
            dVar7 = ::deGetFalse();
            if (dVar7 == 0) {
              (**(code **)(lVar10 + 0x1c0))(0x3f000000,0x3f000000);
              dVar5 = (**(code **)(lVar10 + 0x800))();
              glu::checkError(dVar5,"glClearColor(0.5f, 0.5f, 0.5f, 1.0f)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                              ,0x324);
              (**(code **)(lVar10 + 0x188))(0x4000);
              dVar5 = (**(code **)(lVar10 + 0x800))();
              glu::checkError(dVar5,"glClear(GL_COLOR_BUFFER_BIT)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                              ,0x327);
              (**(code **)(lVar10 + 0x14f0))(GVar6,0);
              dVar5 = (**(code **)(lVar10 + 0x800))();
              glu::checkError(dVar5,"glUniform1i(samplerLoc1, 0)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                              ,0x32a);
              (**(code **)(lVar10 + 0x14f0))(GVar8,1);
              dVar5 = (**(code **)(lVar10 + 0x800))();
              glu::checkError(dVar5,"glUniform1i(samplerLoc2, 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                              ,0x32d);
              (**(code **)(lVar10 + 0x14e0))(0x3f800000,GVar9);
              dVar5 = (**(code **)(lVar10 + 0x800))();
              glu::checkError(dVar5,"glUniform1f(scaleLoc, 1.0f)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                              ,0x330);
              GVar1 = this->m_target;
              if (GVar1 == 0xde1) {
                local_109 = 1;
                local_90 = local_88;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_e0,"a_position",&local_e1);
                glu::BindingPoint::BindingPoint(&local_c0,&local_e0,0);
                glu::VertexArrayPointer::VertexArrayPointer
                          (&local_108,VTX_COMP_FLOAT,VTX_COMP_CONVERT_NONE,2,6,0,s_positions);
                glu::VertexArrayBinding::VertexArrayBinding
                          ((VertexArrayBinding *)local_88,&local_c0,&local_108);
                local_109 = 0;
                glu::BindingPoint::~BindingPoint(&local_c0);
                std::__cxx11::string::~string((string *)&local_e0);
                std::allocator<char>::~allocator(&local_e1);
                pRVar3 = this->m_renderCtx;
                dVar5 = glu::ShaderProgram::getProgram(this->m_program);
                glu::PrimitiveList::PrimitiveList(&local_128,PRIMITIVETYPE_TRIANGLES,6);
                glu::draw(pRVar3,dVar5,1,(VertexArrayBinding *)local_88,&local_128,
                          (DrawUtilCallback *)0x0);
                (**(code **)(lVar10 + 0x14e0))(0x3e800000,GVar9);
                dVar5 = (**(code **)(lVar10 + 0x800))();
                glu::checkError(dVar5,"glUniform1f(scaleLoc, 0.25f)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                                ,0x33e);
                pRVar3 = this->m_renderCtx;
                dVar5 = glu::ShaderProgram::getProgram(this->m_program);
                glu::PrimitiveList::PrimitiveList(&local_140,PRIMITIVETYPE_TRIANGLES,6);
                glu::draw(pRVar3,dVar5,1,(VertexArrayBinding *)local_88,&local_140,
                          (DrawUtilCallback *)0x0);
                local_3e0 = (VertexArrayBinding *)&vertexArrays[0].pointer.data;
                do {
                  local_3e0 = local_3e0 + -1;
                  glu::VertexArrayBinding::~VertexArrayBinding(local_3e0);
                } while (local_3e0 != (VertexArrayBinding *)local_88);
              }
              else if (GVar1 == 0x806f) {
                local_219 = 1;
                local_1a0 = local_198;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1f0,"a_position",&local_1f1);
                glu::BindingPoint::BindingPoint(&local_1d0,&local_1f0,0);
                glu::VertexArrayPointer::VertexArrayPointer
                          (&local_218,VTX_COMP_FLOAT,VTX_COMP_CONVERT_NONE,3,6,0,s_positions3D);
                glu::VertexArrayBinding::VertexArrayBinding
                          ((VertexArrayBinding *)local_198,&local_1d0,&local_218);
                local_219 = 0;
                glu::BindingPoint::~BindingPoint(&local_1d0);
                std::__cxx11::string::~string((string *)&local_1f0);
                std::allocator<char>::~allocator(&local_1f1);
                pRVar3 = this->m_renderCtx;
                dVar5 = glu::ShaderProgram::getProgram(this->m_program);
                glu::PrimitiveList::PrimitiveList(&local_238,PRIMITIVETYPE_TRIANGLES,6);
                glu::draw(pRVar3,dVar5,1,(VertexArrayBinding *)local_198,&local_238,
                          (DrawUtilCallback *)0x0);
                (**(code **)(lVar10 + 0x14e0))(0x3e800000,GVar9);
                dVar5 = (**(code **)(lVar10 + 0x800))();
                glu::checkError(dVar5,"glUniform1f(scaleLoc, 0.25f)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                                ,0x34f);
                pRVar3 = this->m_renderCtx;
                dVar5 = glu::ShaderProgram::getProgram(this->m_program);
                glu::PrimitiveList::PrimitiveList(&local_250,PRIMITIVETYPE_TRIANGLES,6);
                glu::draw(pRVar3,dVar5,1,(VertexArrayBinding *)local_198,&local_250,
                          (DrawUtilCallback *)0x0);
                local_458 = (VertexArrayBinding *)&vertexArrays_1[0].pointer.data;
                do {
                  local_458 = local_458 + -1;
                  glu::VertexArrayBinding::~VertexArrayBinding(local_458);
                } while (local_458 != (VertexArrayBinding *)local_198);
              }
              else if (GVar1 == 0x8513) {
                local_329 = 1;
                local_2b0 = local_2a8;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_300,"a_position",&local_301);
                glu::BindingPoint::BindingPoint(&local_2e0,&local_300,0);
                glu::VertexArrayPointer::VertexArrayPointer
                          (&local_328,VTX_COMP_FLOAT,VTX_COMP_CONVERT_NONE,4,6,0,s_positionsCube);
                glu::VertexArrayBinding::VertexArrayBinding
                          ((VertexArrayBinding *)local_2a8,&local_2e0,&local_328);
                local_329 = 0;
                glu::BindingPoint::~BindingPoint(&local_2e0);
                std::__cxx11::string::~string((string *)&local_300);
                std::allocator<char>::~allocator(&local_301);
                pRVar3 = this->m_renderCtx;
                dVar5 = glu::ShaderProgram::getProgram(this->m_program);
                glu::PrimitiveList::PrimitiveList(&local_348,PRIMITIVETYPE_TRIANGLES,6);
                glu::draw(pRVar3,dVar5,1,(VertexArrayBinding *)local_2a8,&local_348,
                          (DrawUtilCallback *)0x0);
                (**(code **)(lVar10 + 0x14e0))(0x3e800000,GVar9);
                dVar5 = (**(code **)(lVar10 + 0x800))();
                glu::checkError(dVar5,"glUniform1f(scaleLoc, 0.25f)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                                ,0x360);
                pRVar3 = this->m_renderCtx;
                dVar5 = glu::ShaderProgram::getProgram(this->m_program);
                glu::PrimitiveList::PrimitiveList(&local_360,PRIMITIVETYPE_TRIANGLES,6);
                glu::draw(pRVar3,dVar5,1,(VertexArrayBinding *)local_2a8,&local_360,
                          (DrawUtilCallback *)0x0);
                local_4d0 = (VertexArrayBinding *)&vertexArrays_2[0].pointer.data;
                do {
                  local_4d0 = local_4d0 + -1;
                  glu::VertexArrayBinding::~VertexArrayBinding(local_4d0);
                } while (local_4d0 != (VertexArrayBinding *)local_2a8);
              }
              return;
            }
          }
          pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar11,(char *)0x0,"scaleLoc != (GLuint)-1",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                     ,0x321);
          __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
      }
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar11,(char *)0x0,"samplerLoc2 != (GLuint)-1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                 ,0x31e);
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar11,(char *)0x0,"samplerLoc1 != (GLuint)-1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
             ,0x31b);
  __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void MultiTextureSamplerTest::render (void)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	GLuint	samplerLoc1	= (GLuint)-1;
	GLuint	samplerLoc2	= (GLuint)-1;
	GLuint	scaleLoc	= (GLuint)-1;

	gl.useProgram(m_program->getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram(m_program->getProgram())");

	samplerLoc1 = glGetUniformLocation(m_program->getProgram(), "u_sampler1");
	TCU_CHECK(samplerLoc1 != (GLuint)-1);

	samplerLoc2 = glGetUniformLocation(m_program->getProgram(), "u_sampler2");
	TCU_CHECK(samplerLoc2 != (GLuint)-1);

	scaleLoc = glGetUniformLocation(m_program->getProgram(), "u_posScale");
	TCU_CHECK(scaleLoc != (GLuint)-1);

	gl.clearColor(0.5f, 0.5f, 0.5f, 1.0f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor(0.5f, 0.5f, 0.5f, 1.0f)");

	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClear(GL_COLOR_BUFFER_BIT)");

	gl.uniform1i(samplerLoc1, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i(samplerLoc1, 0)");

	gl.uniform1i(samplerLoc2, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i(samplerLoc2, 1)");

	gl.uniform1f(scaleLoc, 1.0f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1f(scaleLoc, 1.0f)");

	switch (m_target)
	{
		case GL_TEXTURE_2D:
		{
			glu::VertexArrayBinding vertexArrays[] =
			{
				glu::VertexArrayBinding(glu::BindingPoint("a_position"), glu::VertexArrayPointer(glu::VTX_COMP_FLOAT, glu::VTX_COMP_CONVERT_NONE, 2, 6, 0, s_positions))
			};

			glu::draw(m_renderCtx, m_program->getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays, glu::PrimitiveList(glu::PRIMITIVETYPE_TRIANGLES, 6));

			gl.uniform1f(scaleLoc, 0.25f);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1f(scaleLoc, 0.25f)");

			glu::draw(m_renderCtx, m_program->getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays, glu::PrimitiveList(glu::PRIMITIVETYPE_TRIANGLES, 6));

			break;
		}

		case GL_TEXTURE_3D:
		{
			glu::VertexArrayBinding vertexArrays[] =
			{
				glu::VertexArrayBinding(glu::BindingPoint("a_position"), glu::VertexArrayPointer(glu::VTX_COMP_FLOAT, glu::VTX_COMP_CONVERT_NONE, 3, 6, 0, s_positions3D))
			};

			glu::draw(m_renderCtx, m_program->getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays, glu::PrimitiveList(glu::PRIMITIVETYPE_TRIANGLES, 6));

			gl.uniform1f(scaleLoc, 0.25f);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1f(scaleLoc, 0.25f)");

			glu::draw(m_renderCtx, m_program->getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays, glu::PrimitiveList(glu::PRIMITIVETYPE_TRIANGLES, 6));

			break;
		}

		case GL_TEXTURE_CUBE_MAP:
		{
			glu::VertexArrayBinding vertexArrays[] =
			{
				glu::VertexArrayBinding(glu::BindingPoint("a_position"), glu::VertexArrayPointer(glu::VTX_COMP_FLOAT, glu::VTX_COMP_CONVERT_NONE, 4, 6, 0, s_positionsCube))
			};

			glu::draw(m_renderCtx, m_program->getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays, glu::PrimitiveList(glu::PRIMITIVETYPE_TRIANGLES, 6));

			gl.uniform1f(scaleLoc, 0.25f);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1f(scaleLoc, 0.25f)");

			glu::draw(m_renderCtx, m_program->getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays, glu::PrimitiveList(glu::PRIMITIVETYPE_TRIANGLES, 6));

			break;
		}

		default:
			DE_ASSERT(false);
	}
}